

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  
  pcVar3 = FLAGS_gtest_color_abi_cxx11_;
  bVar1 = String::CaseInsensitiveCStringEquals(FLAGS_gtest_color_abi_cxx11_,"auto");
  if (bVar1) {
    pcVar3 = getenv("TERM");
    bVar2 = String::CStringEquals(pcVar3,"xterm");
    bVar1 = true;
    if (!bVar2) {
      bVar2 = String::CStringEquals(pcVar3,"xterm-color");
      if (!bVar2) {
        bVar2 = String::CStringEquals(pcVar3,"xterm-256color");
        if (!bVar2) {
          bVar2 = String::CStringEquals(pcVar3,"screen");
          if (!bVar2) {
            bVar2 = String::CStringEquals(pcVar3,"screen-256color");
            if (!bVar2) {
              bVar2 = String::CStringEquals(pcVar3,"rxvt-unicode");
              if (!bVar2) {
                bVar2 = String::CStringEquals(pcVar3,"rxvt-unicode-256color");
                if (!bVar2) {
                  bVar2 = String::CStringEquals(pcVar3,"linux");
                  if (!bVar2) {
                    bVar1 = String::CStringEquals(pcVar3,"cygwin");
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = (bool)(bVar1 & stdout_is_tty);
  }
  else {
    bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"yes");
    bVar1 = true;
    if (!bVar2) {
      bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"true");
      if (!bVar2) {
        bVar2 = String::CaseInsensitiveCStringEquals(pcVar3,"t");
        if (!bVar2) {
          bVar1 = String::CStringEquals(pcVar3,"1");
          return bVar1;
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  const char* const gtest_color = GTEST_FLAG(color).c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if GTEST_OS_WINDOWS
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        String::CStringEquals(term, "xterm") ||
        String::CStringEquals(term, "xterm-color") ||
        String::CStringEquals(term, "xterm-256color") ||
        String::CStringEquals(term, "screen") ||
        String::CStringEquals(term, "screen-256color") ||
        String::CStringEquals(term, "rxvt-unicode") ||
        String::CStringEquals(term, "rxvt-unicode-256color") ||
        String::CStringEquals(term, "linux") ||
        String::CStringEquals(term, "cygwin");
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
      String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
      String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}